

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid_column_reader.hpp
# Opt level: O0

hugeint_t duckdb::UUIDValueConversion::PlainRead<false>(ByteBuffer *plain_data,ColumnReader *reader)

{
  const_data_ptr_t input;
  ByteBuffer *in_RDI;
  hugeint_t hVar1;
  hugeint_t res;
  
  input = const_data_ptr_cast<unsigned_char>(in_RDI->ptr);
  hVar1 = ReadParquetUUID(input);
  ByteBuffer::unsafe_inc(in_RDI,0x10);
  return hVar1;
}

Assistant:

static hugeint_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		if (CHECKED) {
			plain_data.available(sizeof(hugeint_t));
		}
		auto res = ReadParquetUUID(const_data_ptr_cast(plain_data.ptr));
		plain_data.unsafe_inc(sizeof(hugeint_t));
		return res;
	}